

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData * __thiscall
deqp::gles3::Performance::anon_unknown_1::LoopUnrollCase::generateProgramData
          (ProgramData *__return_storage_ptr__,LoopUnrollCase *this,bool optimized)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  CaseShaderType shaderType;
  long *plVar3;
  undefined8 *puVar4;
  mapped_type *pmVar5;
  undefined8 uVar6;
  ulong *puVar7;
  size_type *psVar8;
  undefined7 in_register_00000011;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBP;
  ulong uVar9;
  _Alloc_hider _Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **unaff_R13;
  ulong *unaff_R14;
  string repetition;
  size_type __dnew;
  string local_2e8;
  ulong *local_2c8;
  long local_2c0;
  ulong local_2b8;
  long lStack_2b0;
  string local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  pointer local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  string local_268;
  key_type local_248;
  string local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_208;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined1 uStack_1f4;
  undefined1 uStack_1f3;
  undefined2 uStack_1f2;
  StringTemplate local_1e8;
  string local_1c8;
  undefined1 local_1a8 [32];
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  if ((int)CONCAT71(in_register_00000011,optimized) == 0) {
    uVar2 = this->m_numRepetitions;
    unaff_RBP = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(ulong)uVar2;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    if (this->m_caseType == CASETYPE_DEPENDENT) {
      local_1a8._0_8_ = (pointer)0x12;
      local_268._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_268,(ulong)local_1a8);
      *(undefined8 *)local_268._M_dataplus._M_p = 0x203d2065756c6176;
      *(undefined8 *)((long)local_268._M_dataplus._M_p + 8) = 0x756c6176286e6973;
      *(undefined2 *)((long)local_268._M_dataplus._M_p + 0x10) = 0x2965;
    }
    else {
      if (this->m_caseType != CASETYPE_INDEPENDENT) goto LAB_006cfbd3;
      local_1a8._0_8_ = (pointer)0x27;
      local_268._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_268,(ulong)local_1a8);
      *(undefined8 *)((long)local_268._M_dataplus._M_p + 0x10) = 0x58444e7b24287461;
      *(undefined8 *)((long)local_268._M_dataplus._M_p + 0x18) = 0x6c61762a29312b7d;
      *(undefined8 *)local_268._M_dataplus._M_p = 0x3d2b2065756c6176;
      *(undefined8 *)((long)local_268._M_dataplus._M_p + 8) = 0x6f6c66286e697320;
      builtin_strncpy((char *)((long)local_268._M_dataplus._M_p + 0x1f),"lueOrig)",8);
    }
    local_268._M_dataplus._M_p[local_1a8._0_8_] = '\0';
    local_268._M_string_length = local_1a8._0_8_;
    local_268.field_2._M_allocated_capacity = local_1a8._0_8_;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<(local_1a8,uVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_228,0,(char *)0x0,0xb52a6d);
    local_288 = &local_278;
    psVar8 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_278._M_allocated_capacity = *psVar8;
      local_278._8_8_ = puVar4[3];
    }
    else {
      local_278._M_allocated_capacity = *psVar8;
      local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar4;
    }
    local_280 = (pointer)puVar4[1];
    *puVar4 = psVar8;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_288);
    unaff_R14 = &local_2b8;
    local_2c8 = (ulong *)*plVar3;
    puVar7 = (ulong *)(plVar3 + 2);
    if (local_2c8 == puVar7) {
      local_2b8 = *puVar7;
      lStack_2b0 = plVar3[3];
      local_2c8 = unaff_R14;
    }
    else {
      local_2b8 = *puVar7;
    }
    local_2c0 = plVar3[1];
    *plVar3 = (long)puVar7;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    tcu::StringTemplate::StringTemplate(&local_1e8,&local_268);
    unaff_RBP = &local_248.field_2;
    local_248.field_2._M_allocated_capacity._0_4_ = 0x58444e;
    local_248._M_string_length = 3;
    unaff_R13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)&local_1f8;
    local_1f8 = 0x69;
    local_200 = 1;
    local_1a8._8_8_ = (ulong)(uint)local_1a8._12_4_ << 0x20;
    local_1a8._16_8_ = (_Base_ptr)0x0;
    local_180 = 0;
    local_248._M_dataplus._M_p = (pointer)unaff_RBP;
    local_208 = unaff_R13;
    local_1a8._24_8_ = (_Base_ptr)(local_1a8 + 8);
    local_188 = (_Base_ptr)(local_1a8 + 8);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_1a8,&local_248);
    std::__cxx11::string::_M_assign((string *)pmVar5);
    tcu::StringTemplate::specialize
              (&local_2a8,&local_1e8,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_1a8);
    uVar9 = 0xf;
    if (local_2c8 != unaff_R14) {
      uVar9 = local_2b8;
    }
    if (uVar9 < local_2a8._M_string_length + local_2c0) {
      uVar6 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        uVar6 = local_2a8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar6 < local_2a8._M_string_length + local_2c0) goto LAB_006cf728;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_2a8,0,(char *)0x0,(ulong)local_2c8);
    }
    else {
LAB_006cf728:
      puVar4 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_2c8,(ulong)local_2a8._M_dataplus._M_p)
      ;
    }
    local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
    psVar8 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_2e8.field_2._M_allocated_capacity = *psVar8;
      local_2e8.field_2._8_8_ = puVar4[3];
    }
    else {
      local_2e8.field_2._M_allocated_capacity = *psVar8;
      local_2e8._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_2e8._M_string_length = puVar4[1];
    *puVar4 = psVar8;
    puVar4[1] = 0;
    *(undefined1 *)psVar8 = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_2e8);
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    psVar8 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_1c8.field_2._M_allocated_capacity = *psVar8;
      local_1c8.field_2._8_8_ = plVar3[3];
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar8;
      local_1c8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_1c8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
      operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
      operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_1a8);
    if (local_208 != unaff_R13) {
      operator_delete(local_208,
                      CONCAT26(uStack_1f2,
                               CONCAT15(uStack_1f3,
                                        CONCAT14(uStack_1f4,CONCAT22(uStack_1f6,local_1f8)))) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != unaff_RBP) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    tcu::StringTemplate::~StringTemplate(&local_1e8);
    if (local_2c8 != unaff_R14) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_288 != &local_278) {
      operator_delete(local_288,local_278._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
LAB_006cf8d4:
    if (optimized) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
        operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
      }
      if (local_2c8 != &local_2b8) {
        operator_delete(local_2c8,local_2b8 + 1);
      }
      uVar6 = local_278._M_allocated_capacity;
      _Var10._M_p = (pointer)local_288;
      if (local_288 != &local_278) {
LAB_006cf963:
        operator_delete(_Var10._M_p,uVar6 + 1);
      }
    }
    else {
      uVar6 = local_268.field_2._M_allocated_capacity;
      _Var10._M_p = local_268._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) goto LAB_006cf963;
    }
    shaderType = (this->super_ShaderOptimizationCase).m_caseShaderType;
    optimized = SUB41(shaderType,0);
    local_208 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 **)&local_1f8;
    if (shaderType < CASESHADERTYPE_LAST) {
      uStack_1f4 = 0x70;
      local_1f8 = 0x6968;
      uStack_1f6 = 0x6867;
      local_200 = 5;
      uStack_1f3 = 0;
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_208,0,(char *)0x0,0xb5f7d0);
      psVar8 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_248.field_2._M_allocated_capacity = *psVar8;
        local_248.field_2._8_8_ = plVar3[3];
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      }
      else {
        local_248.field_2._M_allocated_capacity = *psVar8;
        local_248._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_248._M_string_length = plVar3[1];
      *plVar3 = (long)psVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_248);
      paVar1 = &local_1e8.m_template.field_2;
      psVar8 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_1e8.m_template.field_2._M_allocated_capacity = *psVar8;
        local_1e8.m_template.field_2._8_8_ = plVar3[3];
        local_1e8.m_template._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1e8.m_template.field_2._M_allocated_capacity = *psVar8;
        local_1e8.m_template._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_1e8.m_template._M_string_length = plVar3[1];
      *plVar3 = (long)psVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1e8,(ulong)local_1c8._M_dataplus._M_p);
      psVar8 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_2a8.field_2._M_allocated_capacity = *psVar8;
        local_2a8.field_2._8_8_ = plVar3[3];
        local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar8;
        local_2a8._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_2a8._M_string_length = plVar3[1];
      *plVar3 = (long)psVar8;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      local_1a8._8_8_ = 0;
      local_1a8._16_8_ = local_1a8._16_8_ & 0xffffffffffffff00;
      local_1a8._0_8_ = local_1a8 + 0x10;
      defaultProgramData(__return_storage_ptr__,shaderType,(string *)local_1a8,&local_2a8);
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,(ulong)(local_1a8._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8.m_template._M_dataplus._M_p != paVar1) {
        operator_delete(local_1e8.m_template._M_dataplus._M_p,
                        local_1e8.m_template.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (local_208 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           **)&local_1f8) {
        operator_delete(local_208,
                        CONCAT26(uStack_1f2,
                                 CONCAT15(uStack_1f3,
                                          CONCAT14(uStack_1f4,CONCAT22(uStack_1f6,local_1f8)))) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    std::__throw_logic_error("basic_string::_M_construct null not valid");
  }
  else {
    local_288 = &local_278;
    if (this->m_caseType == CASETYPE_DEPENDENT) {
      local_1a8._0_8_ = (pointer)0x12;
      local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)std::__cxx11::string::_M_create((ulong *)&local_288,(ulong)local_1a8);
      local_288->_M_allocated_capacity = 0x203d2065756c6176;
      (&local_288->_M_allocated_capacity)[1] = 0x756c6176286e6973;
      *(undefined2 *)(&local_288->_M_allocated_capacity + 2) = 0x2965;
LAB_006cf3bc:
      unaff_R13 = &local_288;
      local_288->_M_local_buf[local_1a8._0_8_] = '\0';
      local_280 = (pointer)local_1a8._0_8_;
      local_278._M_allocated_capacity = local_1a8._0_8_;
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,0xb5f7d0);
      local_2c8 = &local_2b8;
      puVar7 = (ulong *)(plVar3 + 2);
      if ((ulong *)*plVar3 == puVar7) {
        local_2b8 = *puVar7;
        lStack_2b0 = plVar3[3];
      }
      else {
        local_2b8 = *puVar7;
        local_2c8 = (ulong *)*plVar3;
      }
      local_2c0 = plVar3[1];
      *plVar3 = (long)puVar7;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_2c8);
      local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
      psVar8 = puVar4 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_2e8.field_2._M_allocated_capacity = *psVar8;
        local_2e8.field_2._8_8_ = puVar4[3];
      }
      else {
        local_2e8.field_2._M_allocated_capacity = *psVar8;
        local_2e8._M_dataplus._M_p = (pointer)*puVar4;
      }
      local_2e8._M_string_length = puVar4[1];
      *puVar4 = psVar8;
      puVar4[1] = 0;
      *(undefined1 *)(puVar4 + 2) = 0;
      uVar2 = this->m_numRepetitions;
      unaff_RBP = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(ulong)uVar2;
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"");
      repeatIndexedTemplate(&local_1c8,&local_2e8,uVar2,&local_228,0);
      goto LAB_006cf8d4;
    }
    if (this->m_caseType == CASETYPE_INDEPENDENT) {
      local_1a8._0_8_ = (pointer)0x27;
      local_288 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)std::__cxx11::string::_M_create((ulong *)&local_288,(ulong)local_1a8);
      local_288->_M_allocated_capacity = 0x3d2b2065756c6176;
      (&local_288->_M_allocated_capacity)[1] = 0x6f6c66286e697320;
      (&local_288->_M_allocated_capacity)[2] = 0x58444e7b24287461;
      (&local_288->_M_allocated_capacity)[3] = 0x6c61762a29312b7d;
      builtin_strncpy((char *)((long)local_288 + 0x1f),"lueOrig)",8);
      goto LAB_006cf3bc;
    }
  }
  std::__throw_logic_error("basic_string::_M_construct null not valid");
LAB_006cfbd3:
  uVar6 = std::__throw_logic_error("basic_string::_M_construct null not valid");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_1a8);
  if (local_208 != unaff_R13) {
    operator_delete(local_208,
                    CONCAT26(uStack_1f2,
                             CONCAT15(uStack_1f3,CONCAT14(uStack_1f4,CONCAT22(uStack_1f6,local_1f8))
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != unaff_RBP) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::~StringTemplate(&local_1e8);
  if (local_2c8 != unaff_R14) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if (local_288 != &local_278) {
    operator_delete(local_288,local_278._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((optimized != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2)) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((optimized != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2)) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((optimized != false) && (local_2c8 != &local_2b8)) {
    operator_delete(local_2c8,local_2b8 + 1);
  }
  if ((optimized != false) && (local_288 != &local_278)) {
    operator_delete(local_288,local_278._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

ProgramData generateProgramData (bool optimized) const
	{
		const string repetition = optimized ? repeatIndexedTemplate("\t" + expressionTemplate(m_caseType) + ";\n", m_numRepetitions)
											: loop(m_numRepetitions, expressionTemplate(m_caseType));

		return defaultProgramData(m_caseShaderType, "\t" + getShaderPrecision(m_caseShaderType) + " vec4 valueOrig = value;\n" + repetition);
	}